

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::~IfcColumnType(IfcColumnType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x826628;
  *(undefined8 *)&this->field_0x30 = 0x826740;
  *(undefined8 *)&this[-1].field_0xd0 = 0x826650;
  *(undefined8 *)&this[-1].field_0xe0 = 0x826678;
  *(undefined8 *)&this[-1].field_0x138 = 0x8266a0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8266c8;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8266f0;
  *(undefined8 *)this = 0x826718;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x826a08;
  *(undefined8 *)&this->field_0x30 = 0x826ad0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x826a30;
  *(undefined8 *)&this[-1].field_0xe0 = 0x826a58;
  *(undefined8 *)&this[-1].field_0x138 = 0x826a80;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x826aa8;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>.field_0x20
     ) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00826768);
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}